

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O2

int PHYSFS_caseFold(PHYSFS_uint32 from,PHYSFS_uint32 *to)

{
  ulong uVar1;
  ushort *puVar2;
  undefined4 uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  if (from < 0x80) {
    uVar6 = from | 0x20;
    if (0x19 < from - 0x41) {
      uVar6 = from;
    }
    *to = uVar6;
  }
  else {
    uVar6 = from >> 8 ^ from;
    if (from < 0x10000) {
      uVar7 = (ulong)((uVar6 & 0xff) << 4);
      uVar8 = 0;
      do {
        if ((&case_fold_hash1_16[0].count)[uVar7] == uVar8) {
          uVar7 = (ulong)((uVar6 & 0xf) << 4);
          lVar9 = 0;
          while (lVar4 = lVar9 + 6, (ulong)(&case_fold_hash2_16[0].count)[uVar7] * 6 + 6 != lVar4) {
            lVar5 = *(long *)((long)&case_fold_hash2_16[0].list + uVar7);
            puVar2 = (ushort *)(lVar5 + lVar9);
            lVar9 = lVar4;
            if (*puVar2 == from) {
              uVar3 = *(undefined4 *)(lVar5 + -4 + lVar4);
              *(ulong *)to = (ulong)(CONCAT24((short)((uint)uVar3 >> 0x10),uVar3) & 0xffff0000ffff);
              return 2;
            }
          }
          uVar7 = (ulong)((uVar6 & 3) << 4);
          uVar8 = 0;
          while ((&case_fold_hash3_16[0].count)[uVar7] != uVar8) {
            lVar4 = *(long *)((long)&case_fold_hash3_16[0].list + uVar7);
            lVar9 = uVar8 * 8;
            uVar8 = uVar8 + 1;
            if (*(ushort *)(lVar4 + lVar9) == from) {
              uVar3 = *(undefined4 *)(lVar4 + -6 + uVar8 * 8);
              *(ulong *)to = (ulong)(CONCAT24((short)((uint)uVar3 >> 0x10),uVar3) & 0xffff0000ffff);
              to[2] = (uint)*(ushort *)(lVar4 + -2 + uVar8 * 8);
              return 3;
            }
          }
LAB_0010b0d4:
          *to = from;
          return 1;
        }
        lVar4 = *(long *)((long)&case_fold_hash1_16[0].list + uVar7);
        lVar9 = uVar8 * 4;
        uVar8 = uVar8 + 1;
      } while (*(ushort *)(lVar4 + lVar9) != from);
      uVar6 = (uint)*(ushort *)(lVar4 + -2 + uVar8 * 4);
    }
    else {
      uVar8 = (ulong)((uVar6 & 0xf) << 4);
      uVar7 = 0;
      do {
        if ((&case_fold_hash1_32[0].count)[uVar8] == uVar7) goto LAB_0010b0d4;
        lVar4 = *(long *)((long)&case_fold_hash1_32[0].list + uVar8);
        uVar1 = uVar7 + 1;
        lVar9 = uVar7 * 8;
        uVar7 = uVar1;
      } while (*(PHYSFS_uint32 *)(lVar4 + lVar9) != from);
      uVar6 = *(uint *)(lVar4 + -4 + uVar1 * 8);
    }
    *to = uVar6;
  }
  return 1;
}

Assistant:

int PHYSFS_caseFold(const PHYSFS_uint32 from, PHYSFS_uint32 *to)
{
    int i;

    if (from < 128)  /* low-ASCII, easy! */
    {
        if ((from >= 'A') && (from <= 'Z'))
            *to = from - ('A' - 'a');
        else
            *to = from;
        return 1;
    } /* if */

    else if (from <= 0xFFFF)
    {
        const PHYSFS_uint8 hash = ((from ^ (from >> 8)) & 0xFF);
        const PHYSFS_uint16 from16 = (PHYSFS_uint16) from;

        {
            const CaseFoldHashBucket1_16 *bucket = &case_fold_hash1_16[hash];
            const int count = (int) bucket->count;
            for (i = 0; i < count; i++)
            {
                const CaseFoldMapping1_16 *mapping = &bucket->list[i];
                if (mapping->from == from16)
                {
                    *to = mapping->to0;
                    return 1;
                } /* if */
            } /* for */
        }

        {
            const CaseFoldHashBucket2_16 *bucket = &case_fold_hash2_16[hash & 15];
            const int count = (int) bucket->count;
            for (i = 0; i < count; i++)
            {
                const CaseFoldMapping2_16 *mapping = &bucket->list[i];
                if (mapping->from == from16)
                {
                    to[0] = mapping->to0;
                    to[1] = mapping->to1;
                    return 2;
                } /* if */
            } /* for */
        }

        {
            const CaseFoldHashBucket3_16 *bucket = &case_fold_hash3_16[hash & 3];
            const int count = (int) bucket->count;
            for (i = 0; i < count; i++)
            {
                const CaseFoldMapping3_16 *mapping = &bucket->list[i];
                if (mapping->from == from16)
                {
                    to[0] = mapping->to0;
                    to[1] = mapping->to1;
                    to[2] = mapping->to2;
                    return 3;
                } /* if */
            } /* for */
        }
    } /* else if */

    else  /* codepoint that doesn't fit in 16 bits. */
    {
        const PHYSFS_uint8 hash = ((from ^ (from >> 8)) & 0xFF);
        const CaseFoldHashBucket1_32 *bucket = &case_fold_hash1_32[hash & 15];
        const int count = (int) bucket->count;
        for (i = 0; i < count; i++)
        {
            const CaseFoldMapping1_32 *mapping = &bucket->list[i];
            if (mapping->from == from)
            {
                *to = mapping->to0;
                return 1;
            } /* if */
        } /* for */
    } /* else */


    /* Not found...there's no remapping for this codepoint. */
    *to = from;
    return 1;
}